

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O2

void Style::addDataConstraints
               (Entry *entry,
               vector<Style::DataConstraint,_std::allocator<Style::DataConstraint>_>
               *dataConstraints)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pDVar3;
  iterator iVar4;
  __node_base *p_Var5;
  DataConstraint *constraint;
  pointer pDVar6;
  undefined8 uVar7;
  
  pDVar3 = (dataConstraints->
           super__Vector_base<Style::DataConstraint,_std::allocator<Style::DataConstraint>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pDVar6 = (dataConstraints->
                super__Vector_base<Style::DataConstraint,_std::allocator<Style::DataConstraint>_>).
                _M_impl.super__Vector_impl_data._M_start; pDVar6 != pDVar3; pDVar6 = pDVar6 + 1) {
    p_Var5 = &(pDVar6->fields)._M_h._M_before_begin;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(entry->fields)._M_h,(key_type *)(p_Var5 + 1));
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
          ._M_cur != (__node_type *)0x0) {
        *(ConstraintType *)
         ((long)iVar4.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                ._M_cur + 0x58) = pDVar6->type;
        uVar1 = pDVar6->rangeMin;
        uVar2 = pDVar6->rangeMax;
        uVar7 = CONCAT44(uVar1,uVar2);
        *(undefined8 *)
         ((long)iVar4.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                ._M_cur + 0x5c) = uVar7;
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)iVar4.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                          ._M_cur + 0x68));
      }
    }
  }
  return;
}

Assistant:

void addDataConstraints (Entry &entry, vector<DataConstraint> &dataConstraints) {
    for (const DataConstraint &constraint : dataConstraints) {
        for (const u16string &fieldName : constraint.fields) {
            auto itr = entry.fields.find(fieldName);
            if (itr == entry.fields.end()) continue;
            Field &field = itr->second;

            field.constraintType = constraint.type;
            field.rangeMax = constraint.rangeMax;
            field.rangeMin = constraint.rangeMin;
            field.pattern = constraint.pattern;
        }
    }
}